

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
FxVectorBuiltin::FxVectorBuiltin(FxVectorBuiltin *this,FxExpression *self,FName *name)

{
  FxExpression::FxExpression(&this->super_FxExpression,EFX_VectorBuiltin,&self->ScriptPosition);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxVectorBuiltin_00706ca0;
  (this->Function).Index = 0;
  this->Self = self;
  (this->Function).Index = name->Index;
  return;
}

Assistant:

FxVectorBuiltin::FxVectorBuiltin(FxExpression *self, FName name)
	:FxExpression(EFX_VectorBuiltin, self->ScriptPosition)
{
	Self = self;
	Function = name;
}